

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetRepeatedStringReference
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index,
          string *scratch)

{
  Type TVar1;
  uint32 uVar2;
  string *psVar3;
  RepeatedPtrFieldBase *this_00;
  Type *pTVar4;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedStringReference",
               "Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedStringReference",
               "Field is singular; the method requires a repeated field.");
  }
  TVar1 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedStringReference",CPPTYPE_STRING);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar2 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    psVar3 = ExtensionSet::GetRepeatedString_abi_cxx11_
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                        *(int *)(field + 0x38),index);
    return psVar3;
  }
  this_00 = &GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(this,message,field)->
             super_RepeatedPtrFieldBase;
  pTVar4 = RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(this_00,index)
  ;
  return pTVar4;
}

Assistant:

const string& GeneratedMessageReflection::GetRepeatedStringReference(
    const Message& message, const FieldDescriptor* field,
    int index, string* scratch) const {
  USAGE_CHECK_ALL(GetRepeatedStringReference, REPEATED, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        return GetRepeatedPtrField<string>(message, field, index);
    }

    GOOGLE_LOG(FATAL) << "Can't get here.";
    return GetEmptyString();  // Make compiler happy.
  }
}